

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O3

void Fxu_ListDoubleAddPairFirst(Fxu_Double *pDiv,Fxu_Pair *pLink)

{
  int *piVar1;
  Fxu_Pair *pFVar2;
  Fxu_Pair *pFVar3;
  Fxu_Pair *pFVar4;
  
  pFVar2 = (pDiv->lPairs).pHead;
  if (pFVar2 == (Fxu_Pair *)0x0) {
    (pDiv->lPairs).pTail = pLink;
    pFVar3 = (Fxu_Pair *)0x0;
    pFVar4 = pLink;
  }
  else {
    pLink->pDPrev = (Fxu_Pair *)0x0;
    pFVar3 = pLink;
    pFVar4 = pFVar2;
  }
  pFVar4->pDPrev = pFVar3;
  (pDiv->lPairs).pHead = pLink;
  pLink->pDNext = pFVar2;
  piVar1 = &(pDiv->lPairs).nItems;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void Fxu_ListDoubleAddPairFirst( Fxu_Double * pDiv, Fxu_Pair * pLink )
{
	Fxu_ListPair * pList = &pDiv->lPairs;
	if ( pList->pHead == NULL )
	{
		pList->pHead = pLink;
		pList->pTail = pLink;
		pLink->pDPrev = NULL;
		pLink->pDNext = NULL;
	}
	else
	{
		pLink->pDPrev = NULL;
		pList->pHead->pDPrev = pLink;
		pLink->pDNext = pList->pHead;
		pList->pHead = pLink;
	}
	pList->nItems++;
}